

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O0

int graph_5_4::dfs(m_graph g,int v)

{
  code *pcVar1;
  int v_00;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  byte bVar5;
  m_graph in_stack_fffffffffffffc58;
  undefined8 local_1d0 [56];
  int local_10;
  int local_c;
  int i;
  int v_local;
  
  bVar5 = 0;
  *(undefined4 *)(visited + (long)v * 4) = 1;
  local_c = v;
  for (local_10 = 0; local_10 < g.vnum; local_10 = local_10 + 1) {
    if (*(int *)(visited + (long)local_10 * 4) == 0) {
      memcpy(local_1d0,&g,0x1c0);
      v_00 = local_10;
      puVar3 = local_1d0;
      puVar4 = (undefined8 *)&stack0xfffffffffffffc58;
      for (lVar2 = 0x38; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar4 = *puVar3;
        puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
        puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
      }
      dfs(in_stack_fffffffffffffc58,v_00);
    }
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int dfs(m_graph g, int v) {
        visited[v] = 1;
//        visit
        for (int i = 0; i < g.vnum; i++)
            if (visited[i] == 0)
                dfs(g, i);
    }